

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_RepeatedFieldMoveCtorOnArena_Test::TestBody
          (ArenaTest_RepeatedFieldMoveCtorOnArena_Test *this)

{
  bool bVar1;
  RepeatedField<int> *this_00;
  char *pcVar2;
  const_reference piVar3;
  AssertHelper local_1f8;
  Message local_1f0;
  int local_1e8;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_6;
  Message local_1c8;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_5;
  Message local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  int local_170;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  RepeatedField<int> *moved;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_f8;
  Message local_f0;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  RepeatedField<int> *original;
  Arena arena;
  ArenaTest_RepeatedFieldMoveCtorOnArena_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&original);
  this_00 = Arena::Create<google::protobuf::RepeatedField<int>>((Arena *)&original);
  RepeatedField<int>::Add(this_00,1);
  RepeatedField<int>::Add(this_00,2);
  local_e4 = RepeatedField<int>::size(this_00);
  local_e8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e0,"original->size()","2",&local_e4,&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1c2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    piVar3 = RepeatedField<int>::Get(this_00,0);
    local_114 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_110,"original->Get(0)","1",piVar3,&local_114);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1c3,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_120);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      piVar3 = RepeatedField<int>::Get(this_00,1);
      local_13c = 2;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_138,"original->Get(1)","2",piVar3,&local_13c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&moved,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                   ,0x1c4,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&moved,&local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&moved);
        testing::Message::~Message(&local_148);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        gtest_ar_3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )Arena::
               Create<google::protobuf::RepeatedField<int>,google::protobuf::RepeatedField<int>>
                         ((Arena *)&original,this_00);
        local_16c = RepeatedField<int>::size
                              ((RepeatedField<int> *)
                               gtest_ar_3.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
        local_170 = 2;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_168,"moved->size()","2",&local_16c,&local_170);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1c9,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_178);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_178);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
        piVar3 = RepeatedField<int>::Get
                           ((RepeatedField<int> *)
                            gtest_ar_3.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,0);
        local_194 = 1;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_190,"moved->Get(0)","1",piVar3,&local_194);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
        if (!bVar1) {
          testing::Message::Message(&local_1a0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1ca,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_1a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_1a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
        piVar3 = RepeatedField<int>::Get
                           ((RepeatedField<int> *)
                            gtest_ar_3.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,1);
        local_1bc = 2;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1b8,"moved->Get(1)","2",piVar3,&local_1bc);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1cb,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_1c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
        local_1e4 = RepeatedField<int>::size(this_00);
        local_1e8 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1e0,"original->size()","0",&local_1e4,&local_1e8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
        if (!bVar1) {
          testing::Message::Message(&local_1f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1cf,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
          testing::internal::AssertHelper::~AssertHelper(&local_1f8);
          testing::Message::~Message(&local_1f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  Arena::~Arena((Arena *)&original);
  return;
}

Assistant:

TEST(ArenaTest, RepeatedFieldMoveCtorOnArena) {
  Arena arena;

  auto* original = Arena::Create<RepeatedField<int32_t>>(&arena);
  original->Add(1);
  original->Add(2);
  ASSERT_EQ(original->size(), 2);
  ASSERT_EQ(original->Get(0), 1);
  ASSERT_EQ(original->Get(1), 2);

  auto* moved =
      Arena::Create<RepeatedField<int32_t>>(&arena, std::move(*original));

  EXPECT_EQ(moved->size(), 2);
  EXPECT_EQ(moved->Get(0), 1);
  EXPECT_EQ(moved->Get(1), 2);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  EXPECT_EQ(original->size(), 0);
}